

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O2

void __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::start_consume_impl
          (Consume *this,
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *i_queue)

{
  ulong uVar1;
  
  if (0xf < this->m_next_ptr) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
               ,0xb8);
  }
  begin_iteration(this,i_queue);
  while( true ) {
    uVar1 = this->m_next_ptr;
    if (uVar1 < 0x10) {
      return;
    }
    if ((uVar1 & 0xb) == 0) break;
    if (((uint)uVar1 & 3) == 2) {
      advance_head(this);
    }
    move_next(this);
  }
  raw_atomic_store(&this->m_control->m_next,uVar1 | 1,memory_order_seq_cst);
  *(byte *)&this->m_next_ptr = (byte)this->m_next_ptr | 2;
  return;
}

Assistant:

void start_consume_impl(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            /* found an element to consume, set LfQueue_Busy 
                                todo: the single consumer may probably avoid to do any further atomic
                                    operation on m_control->m_next */

                            raw_atomic_store(
                              &m_control->m_next, m_next_ptr | LfQueue_Busy, mem_relaxed);
                            m_next_ptr |=
                              LfQueue_Dead; /* this is what we will write in m_control->m_next
                                when (and if) we will commit the consume */
                            break;
                        }
                        else if ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                        {
                            advance_head();
                        }
                        move_next();
                    }
                }